

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void serial_synchronize(Emulator *e)

{
  byte bVar1;
  u8 *puVar2;
  u8 uVar3;
  Ticks TVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  
  uVar5 = (e->state).ticks;
  uVar6 = (e->state).serial.sync_ticks;
  lVar8 = uVar6 - uVar5;
  if (uVar6 < uVar5) {
    if (((e->state).serial.transferring != FALSE) &&
       ((e->state).serial.clock == SERIAL_CLOCK_INTERNAL)) {
      TVar4 = (e->state).cpu_tick;
      for (; lVar8 != 0; lVar8 = lVar8 + TVar4) {
        uVar6 = (e->state).serial.tick_count + TVar4;
        uVar5 = uVar6 - 0x200;
        if (0x1ff >= uVar6) {
          uVar5 = uVar6;
        }
        (e->state).serial.tick_count = uVar5;
        if (0x1ff < uVar6) {
          uVar3 = (e->state).serial.transferred_bits;
          (e->state).serial.sb = (e->state).serial.sb * '\x02' + '\x01';
          bVar1 = uVar3 + 1;
          bVar7 = uVar3 - 7;
          if (bVar1 < 8) {
            bVar7 = bVar1;
          }
          (e->state).serial.transferred_bits = bVar7;
          if (bVar1 >= 8) {
            (e->state).serial.transferring = FALSE;
            puVar2 = &(e->state).interrupt.new_if;
            *puVar2 = *puVar2 | 8;
            (e->state).serial.sync_ticks = (e->state).ticks + lVar8;
            calculate_next_serial_intr(e);
          }
        }
        else if ((uVar6 == 0) && ((e->state).serial.transferred_bits == '\0')) {
          puVar2 = &(e->state).interrupt.if_;
          *puVar2 = *puVar2 | (e->state).interrupt.new_if & 8;
        }
      }
      uVar5 = (e->state).ticks;
    }
    (e->state).serial.sync_ticks = uVar5;
  }
  return;
}

Assistant:

static void serial_synchronize(Emulator* e) {
  if (TICKS > SERIAL.sync_ticks) {
    Ticks delta_ticks = TICKS - SERIAL.sync_ticks;

    if (UNLIKELY(SERIAL.transferring &&
                 SERIAL.clock == SERIAL_CLOCK_INTERNAL)) {
      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        SERIAL.tick_count += cpu_tick;
        if (VALUE_WRAPPED(SERIAL.tick_count, SERIAL_TICKS)) {
          /* Since we're never connected to another device, always shift in
           * 0xff. */
          SERIAL.sb = (SERIAL.sb << 1) | 1;
          SERIAL.transferred_bits++;
          if (VALUE_WRAPPED(SERIAL.transferred_bits, 8)) {
            SERIAL.transferring = 0;
            INTR.new_if |= IF_SERIAL;
            SERIAL.sync_ticks = TICKS - delta_ticks;
            calculate_next_serial_intr(e);
          }
        } else if (UNLIKELY(SERIAL.tick_count == 0 &&
                            SERIAL.transferred_bits == 0)) {
          INTR.if_ |= (INTR.new_if & IF_SERIAL);
        }
      }
    }
    SERIAL.sync_ticks = TICKS;
  }
}